

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                       int blk_col,aom_reader *r)

{
  BLOCK_SIZE bsize_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int stride_log2_00;
  int iVar5;
  int in_ECX;
  undefined1 in_DL;
  MACROBLOCKD *in_RSI;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  int in_R9D;
  aom_reader *unaff_retaddr;
  int offsetc;
  int offsetr;
  int col;
  int row;
  int bsh;
  int bsw;
  TX_SIZE sub_txs;
  int ctx;
  int stride_log2;
  int bw_log2;
  int tx_h_log2;
  int tx_w_log2;
  int level;
  TX_SIZE txs;
  int max_blocks_wide;
  int max_blocks_high;
  BLOCK_SIZE bsize;
  int is_split;
  FRAME_CONTEXT *ec_ctx;
  aom_cdf_prob *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  TX_SIZE in_stack_ffffffffffffff8e;
  BLOCK_SIZE in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_40;
  byte local_39;
  FRAME_CONTEXT *pFVar6;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar7;
  byte bVar8;
  TX_SIZE TVar9;
  
  uVar7 = CONCAT13(in_DL,in_stack_ffffffffffffffec);
  pFVar6 = in_RDI->tile_ctx;
  bsize_00 = *(BLOCK_SIZE *)&in_RSI->mi_row;
  iVar3 = max_block_high(in_RDI,bsize_00,0);
  iVar4 = max_block_wide(in_RDI,bsize_00,0);
  if ((in_R8D < iVar3) && (in_R9D < iVar4)) {
    local_39 = ""[bsize_00];
    for (local_40 = 0; local_40 < 1; local_40 = local_40 + 1) {
      local_39 = ""[local_39];
    }
    iVar3 = tx_size_wide_log2[local_39] + -2;
    iVar4 = tx_size_high_log2[local_39] + -2;
    stride_log2_00 = (uint)""[bsize_00] - iVar3;
    if (in_ECX == 2) {
      bVar8 = (byte)((uint)uVar7 >> 0x18);
      set_inter_tx_size((MB_MODE_INFO *)in_RSI,stride_log2_00,iVar3,iVar4,(uint)local_39,(uint)bVar8
                        ,(uint)bVar8,in_R8D,in_R9D);
      TVar9 = (TX_SIZE)((uint)uVar7 >> 0x18);
      *(TX_SIZE *)((long)in_RSI->plane[0].seg_dequant_QTX[0] + 1) = TVar9;
      txfm_partition_update
                (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,TVar9,TVar9)
      ;
    }
    else {
      txfm_partition_context
                ((TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (TXFM_CONTEXT *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8f,in_stack_ffffffffffffff8e);
      iVar5 = aom_read_symbol_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff78,0);
      bVar8 = (byte)((uint)uVar7 >> 0x18);
      if (iVar5 == 0) {
        set_inter_tx_size((MB_MODE_INFO *)in_RSI,stride_log2_00,iVar3,iVar4,(uint)local_39,
                          (uint)bVar8,(uint)bVar8,in_R8D,in_R9D);
        TVar9 = (TX_SIZE)((uint)uVar7 >> 0x18);
        *(TX_SIZE *)((long)in_RSI->plane[0].seg_dequant_QTX[0] + 1) = TVar9;
        txfm_partition_update
                  (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,TVar9,
                   TVar9);
      }
      else {
        bVar1 = ""[bVar8];
        iVar5 = tx_size_wide_unit[bVar1];
        iVar2 = tx_size_high_unit[bVar1];
        if (bVar1 == 0) {
          set_inter_tx_size((MB_MODE_INFO *)in_RSI,stride_log2_00,iVar3,iVar4,(uint)local_39,
                            (uint)bVar8,0,in_R8D,in_R9D);
          *(TX_SIZE *)((long)in_RSI->plane[0].seg_dequant_QTX[0] + 1) = '\0';
          txfm_partition_update
                    (in_RDI->above_txfm_context + in_R9D,in_RDI->left_txfm_context + in_R8D,'\0',
                     (TX_SIZE)((uint)uVar7 >> 0x18));
        }
        else {
          for (iVar3 = 0; iVar3 < tx_size_high_unit[(byte)((uint)uVar7 >> 0x18)];
              iVar3 = iVar2 + iVar3) {
            for (iVar4 = 0; iVar4 < tx_size_wide_unit[(byte)((uint)uVar7 >> 0x18)];
                iVar4 = iVar5 + iVar4) {
              read_tx_size_vartx(in_RSI,(MB_MODE_INFO *)CONCAT44(uVar7,in_ECX),
                                 (TX_SIZE)((uint)in_R8D >> 0x18),in_R9D,(int)((ulong)pFVar6 >> 0x20)
                                 ,(int)pFVar6,unaff_retaddr);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void read_tx_size_vartx(MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
                                      TX_SIZE tx_size, int depth, int blk_row,
                                      int blk_col, aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  int is_split = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);
  TX_SIZE txs = max_txsize_rect_lookup[bsize];
  for (int level = 0; level < MAX_VARTX_DEPTH - 1; ++level)
    txs = sub_tx_size_map[txs];
  const int tx_w_log2 = tx_size_wide_log2[txs] - MI_SIZE_LOG2;
  const int tx_h_log2 = tx_size_high_log2[txs] - MI_SIZE_LOG2;
  const int bw_log2 = mi_size_wide_log2[bsize];
  const int stride_log2 = bw_log2 - tx_w_log2;

  if (depth == MAX_VARTX_DEPTH) {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  is_split = aom_read_symbol(r, ec_ctx->txfm_partition_cdf[ctx], 2, ACCT_STR);

  if (is_split) {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    if (sub_txs == TX_4X4) {
      set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                        sub_txs, blk_row, blk_col);
      mbmi->tx_size = sub_txs;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = blk_row + row;
        int offsetc = blk_col + col;
        read_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, r);
      }
    }
  } else {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  }
}